

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O3

string * __thiscall
cmCryptoHashMD5::Finalize_abi_cxx11_(string *__return_storage_ptr__,cmCryptoHashMD5 *this)

{
  pointer pcVar1;
  size_type __dnew;
  char md5out [32];
  size_type local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  cmsysMD5_FinalizeHex(this->MD5,(char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_40 = 0x20;
  pcVar1 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
  *(undefined8 *)(pcVar1 + 0x10) = local_28;
  *(undefined8 *)(pcVar1 + 0x18) = uStack_20;
  *(undefined8 *)pcVar1 = local_38;
  *(undefined8 *)(pcVar1 + 8) = uStack_30;
  __return_storage_ptr__->_M_string_length = local_40;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_40] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHashMD5::Finalize()
{
  char md5out[32];
  cmsysMD5_FinalizeHex(this->MD5, md5out);
  return std::string(md5out, 32);
}